

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate_stream.cpp
# Opt level: O1

void boost::deflate::inflate_stream_test::testInvalidHeader(IDecompressor *d)

{
  error_code eVar1;
  error_code expected;
  error_code expected_00;
  error_code expected_01;
  error_code expected_02;
  error_code expected_03;
  error_code expected_04;
  error_code expected_05;
  error_code expected_06;
  IDecompressor IVar2;
  IDecompressor IVar3;
  IDecompressor local_128;
  undefined8 local_120;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  IVar3._vptr_IDecompressor = (_func_int **)&local_128;
  local_128._vptr_IDecompressor._0_2_ = 0x14;
  IVar2._vptr_IDecompressor = IVar3._vptr_IDecompressor;
  eVar1 = make_error_code(incorrect_header_check);
  expected.cat_ = (error_category *)0x1;
  expected._0_8_ = eVar1.cat_;
  check_abi_cxx11_(&local_38,(inflate_stream_test *)d,(IDecompressor *)&stack0xfffffffffffffeb8,
                   eVar1._0_8_,expected,0xf,0xffffffffffffffff,(size_t)IVar2._vptr_IDecompressor);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  local_128._vptr_IDecompressor._0_2_ = 0x217;
  IVar2._vptr_IDecompressor = IVar3._vptr_IDecompressor;
  eVar1 = make_error_code(unknown_compression_method);
  expected_00.cat_ = (error_category *)0x1;
  expected_00._0_8_ = eVar1.cat_;
  check_abi_cxx11_(&local_58,(inflate_stream_test *)d,(IDecompressor *)&stack0xfffffffffffffeb8,
                   eVar1._0_8_,expected_00,0xf,0xffffffffffffffff,(size_t)IVar2._vptr_IDecompressor)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_128._vptr_IDecompressor._0_2_ = 0xf8;
  IVar2._vptr_IDecompressor = IVar3._vptr_IDecompressor;
  eVar1 = make_error_code(invalid_window_size);
  expected_01.cat_ = (error_category *)0x1;
  expected_01._0_8_ = eVar1.cat_;
  check_abi_cxx11_(&local_78,(inflate_stream_test *)d,(IDecompressor *)&stack0xfffffffffffffeb8,
                   eVar1._0_8_,expected_01,10,0xffffffffffffffff,(size_t)IVar2._vptr_IDecompressor);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  local_128._vptr_IDecompressor._0_4_ = 0x78b1f;
  IVar2._vptr_IDecompressor = IVar3._vptr_IDecompressor;
  eVar1 = make_error_code(unknown_compression_method);
  expected_02.cat_ = (error_category *)0x2;
  expected_02._0_8_ = eVar1.cat_;
  check_abi_cxx11_(&local_98,(inflate_stream_test *)d,(IDecompressor *)&stack0xfffffffffffffeb8,
                   eVar1._0_8_,expected_02,0xf,0xffffffffffffffff,(size_t)IVar2._vptr_IDecompressor)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  local_128._vptr_IDecompressor._0_4_ = 0xe0088b1f;
  IVar2._vptr_IDecompressor = IVar3._vptr_IDecompressor;
  eVar1 = make_error_code(unknown_header_flags);
  expected_03.cat_ = (error_category *)0x2;
  expected_03._0_8_ = eVar1.cat_;
  check_abi_cxx11_(&local_b8,(inflate_stream_test *)d,(IDecompressor *)&stack0xfffffffffffffeb8,
                   eVar1._0_8_,expected_03,0xf,0xffffffffffffffff,(size_t)IVar2._vptr_IDecompressor)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  local_128._vptr_IDecompressor = (_func_int **)0x2088b1f;
  local_120 = CONCAT44(local_120._4_4_,0xffff0304);
  eVar1 = make_error_code(header_crc_mismatch);
  expected_04.cat_ = (error_category *)0x2;
  expected_04._0_8_ = eVar1.cat_;
  check_abi_cxx11_(&local_d8,(inflate_stream_test *)d,(IDecompressor *)&stack0xfffffffffffffeb8,
                   eVar1._0_8_,expected_04,0xf,0xffffffffffffffff,(size_t)IVar3._vptr_IDecompressor)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  IVar3._vptr_IDecompressor = (_func_int **)0x88b1f;
  local_120 = 0x14;
  local_128._vptr_IDecompressor = (_func_int **)&stack0xfffffffffffffeb8;
  eVar1 = make_error_code(incorrect_data_check);
  expected_05.cat_ = (error_category *)0x2;
  expected_05._0_8_ = eVar1.cat_;
  check_abi_cxx11_(&local_f8,(inflate_stream_test *)d,&local_128,eVar1._0_8_,expected_05,0xf,
                   0xffffffffffffffff,(size_t)IVar3._vptr_IDecompressor);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  IVar3._vptr_IDecompressor = (_func_int **)0x88b1f;
  local_120 = 0x14;
  local_128._vptr_IDecompressor = (_func_int **)&stack0xfffffffffffffeb8;
  eVar1 = make_error_code(incorrect_length_check);
  expected_06.cat_ = (error_category *)0x2;
  expected_06._0_8_ = eVar1.cat_;
  check_abi_cxx11_(&local_118,(inflate_stream_test *)d,&local_128,eVar1._0_8_,expected_06,0xf,
                   0xffffffffffffffff,(size_t)IVar3._vptr_IDecompressor);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

static
    void testInvalidHeader(IDecompressor& d)
    {
        check(d, {0x14, 0x00}, error::incorrect_header_check, boost::deflate::wrap::zlib);
        check(d, {0x17, 0x02}, error::unknown_compression_method, boost::deflate::wrap::zlib);
        check(d, {0xf8, 0x00}, error::invalid_window_size, boost::deflate::wrap::zlib, 10);
        check(d, {0x1f, 0x8b, 0x07, 0x00}, error::unknown_compression_method, boost::deflate::wrap::gzip);
        check(d, {0x1f, 0x8b, 0x08, 0xe0}, error::unknown_header_flags, boost::deflate::wrap::gzip);
        check(d, {0x1f, 0x8b, 0x08, 0x02, 0x00, 0x00, 0x00, 0x00, 0x04,
                  0x03, 0xff, 0xff}, error::header_crc_mismatch, boost::deflate::wrap::gzip);
        check(d, {0x1f, 0x8b, 0x08, 0x00,
                  0x00, 0x00, 0x00, 0x00, 0x04, 0x03, 0x03, 0x00,
                  0x00, 0x00, 0x00, 0x01, 0x00, 0x00, 0x00, 0x00}, error::incorrect_data_check, boost::deflate::wrap::gzip);
        check(d, {0x1f, 0x8b, 0x08, 0x00,
                  0x00, 0x00, 0x00, 0x00, 0x04, 0x03, 0x03, 0x00,
                  0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x01}, error::incorrect_length_check, boost::deflate::wrap::gzip);
    }